

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastpackwithoutmask3_8(uint32_t *in,uint32_t *out)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  
  auVar2 = vpsllvd_avx2(*(undefined1 (*) [16])(in + 1),_DAT_001a0ea0);
  auVar1 = vpshufd_avx(auVar2,0xee);
  auVar1 = vpor_avx(auVar2,auVar1);
  auVar2 = vpshufd_avx(auVar1,0x55);
  auVar1 = vpor_avx(auVar1,auVar2);
  *out = auVar1._0_4_ | in[7] << 0x15 | in[6] << 0x12 | in[5] << 0xf | *in;
  return out + 1;
}

Assistant:

uint32_t *__fastpackwithoutmask3_8(const uint32_t *__restrict__ in,
                                   uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 9;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 15;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 21;
  ++in;

  return out + 1;
}